

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

TCount __thiscall
NJamSpell::TLangModel::GetGram3HashCount(TLangModel *this,TWordId word1,TWordId word2,TWordId word3)

{
  tuple<unsigned_int,_unsigned_int,_unsigned_int> local_3c;
  undefined1 local_30 [8];
  TGram3Key key;
  TWordId word3_local;
  TWordId word2_local;
  TWordId word1_local;
  TLangModel *this_local;
  
  if (((word1 == this->UnknownWordId) || (word2 == this->UnknownWordId)) ||
     (word3 == this->UnknownWordId)) {
    this_local._4_4_ = 0;
  }
  else {
    key.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
    _M_head_impl = word3;
    key.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = word2;
    word3_local = word1;
    _word2_local = this;
    std::tuple<unsigned_int,_unsigned_int,_unsigned_int>::
    tuple<unsigned_int_&,_unsigned_int_&,_unsigned_int_&,_true,_true>
              ((tuple<unsigned_int,_unsigned_int,_unsigned_int> *)local_30,&word3_local,
               &key.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
                super__Head_base<0UL,_unsigned_int,_false>._M_head_impl,
               &key.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
                super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
                super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
    local_3c.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_int,_false>)(_Head_base<2UL,_unsigned_int,_false>)local_30._0_4_;
    local_3c.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
    _M_head_impl = local_30._4_4_;
    local_3c.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_unsigned_int,_false>._M_head_impl =
         (uint)key.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
               super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
               super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
               _M_head_impl;
    this_local._4_4_ =
         GetGramHashCount<std::tuple<unsigned_int,unsigned_int,unsigned_int>>
                   (&local_3c,&this->PerfectHash,&this->Buckets);
  }
  return this_local._4_4_;
}

Assistant:

TCount TLangModel::GetGram3HashCount(TWordId word1, TWordId word2, TWordId word3) const {
    if (word1 == UnknownWordId || word2 == UnknownWordId || word3 == UnknownWordId) {
        return TCount();
    }
    TGram3Key key(word1, word2, word3);
    return GetGramHashCount(key, PerfectHash, Buckets);
}